

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowAggStep(Parse *pParse,Window *pMWin,int csr,int bInverse,int reg)

{
  void *pP4;
  int iVar1;
  int iVar2;
  Vdbe *p;
  CollSeq *zP4;
  CollSeq *pColl;
  int regTmp;
  int addrIf;
  int addrIsNull;
  int i;
  int nArg;
  int regArg;
  FuncDef *pFunc;
  Window *pWin;
  Vdbe *v;
  int reg_local;
  int bInverse_local;
  int csr_local;
  Window *pMWin_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  for (pFunc = (FuncDef *)pMWin; pFunc != (FuncDef *)0x0; pFunc = (FuncDef *)pFunc->zName) {
    pP4 = *(void **)(pFunc + 1);
    iVar1 = windowArgCount((Window *)pFunc);
    for (addrIf = 0; addrIf < iVar1; addrIf = addrIf + 1) {
      if ((addrIf == 1) && (*(char **)((long)pP4 + 0x38) == "nth_value")) {
        sqlite3VdbeAddOp3(p,0x5a,pMWin->iEphCsr,*(int *)((long)&pFunc[1].xValue + 4) + 1,reg + 1);
      }
      else {
        sqlite3VdbeAddOp3(p,0x5a,csr,*(int *)((long)&pFunc[1].xValue + 4) + addrIf,reg + addrIf);
      }
    }
    if (((pMWin->regStartRowid == 0) && ((*(uint *)((long)pP4 + 4) & 0x1000) != 0)) &&
       (*(char *)((long)&pFunc->xFinalize + 1) != 'W')) {
      iVar1 = sqlite3VdbeAddOp1(p,0x32,reg);
      if (bInverse == 0) {
        sqlite3VdbeAddOp2(p,0x53,*(int *)&pFunc[1].xSFunc + 1,1);
        sqlite3VdbeAddOp2(p,0x4f,reg,*(int *)&pFunc[1].xSFunc);
        sqlite3VdbeAddOp3(p,0x5c,*(int *)&pFunc[1].xSFunc,2,*(int *)&pFunc[1].xSFunc + 2);
        sqlite3VdbeAddOp2(p,0x84,*(int *)((long)&pFunc[1].pNext + 4),*(int *)&pFunc[1].xSFunc + 2);
      }
      else {
        sqlite3VdbeAddOp4Int(p,0x18,*(int *)((long)&pFunc[1].pNext + 4),0,reg,1);
        sqlite3VdbeAddOp1(p,0x7b,*(int *)((long)&pFunc[1].pNext + 4));
        iVar2 = sqlite3VdbeCurrentAddr(p);
        sqlite3VdbeJumpHere(p,iVar2 + -2);
      }
      sqlite3VdbeJumpHere(p,iVar1);
    }
    else if (*(int *)&pFunc[1].xSFunc == 0) {
      if (*(code **)((long)pP4 + 0x18) != noopStepFunc) {
        pColl._4_4_ = 0;
        if ((pFunc->u).pHash != (FuncDef *)0x0) {
          iVar2 = sqlite3GetTempReg(pParse);
          sqlite3VdbeAddOp3(p,0x5a,csr,*(int *)((long)&pFunc[1].xValue + 4) + iVar1,iVar2);
          pColl._4_4_ = sqlite3VdbeAddOp3(p,0x14,iVar2,0,1);
          sqlite3ReleaseTempReg(pParse,iVar2);
        }
        if ((*(uint *)((long)pP4 + 4) & 0x20) != 0) {
          zP4 = sqlite3ExprNNCollSeq(pParse,*(Expr **)(*(long *)(pFunc[1].xFinalize + 0x20) + 8));
          sqlite3VdbeAddOp4(p,0x52,0,0,0,(char *)zP4,-2);
        }
        iVar2 = 0x9a;
        if (bInverse != 0) {
          iVar2 = 0x99;
        }
        sqlite3VdbeAddOp3(p,iVar2,bInverse,reg,*(int *)((long)&pFunc[1].pUserData + 4));
        sqlite3VdbeAppendP4(p,pP4,-8);
        sqlite3VdbeChangeP5(p,(ushort)iVar1 & 0xff);
        if (pColl._4_4_ != 0) {
          sqlite3VdbeJumpHere(p,pColl._4_4_);
        }
      }
    }
    else {
      sqlite3VdbeAddOp2(p,0x53,(*(int *)&pFunc[1].xSFunc + 1) - bInverse,1);
    }
  }
  return;
}

Assistant:

static void windowAggStep(
  Parse *pParse, 
  Window *pMWin,                  /* Linked list of window functions */
  int csr,                        /* Read arguments from this cursor */
  int bInverse,                   /* True to invoke xInverse instead of xStep */
  int reg                         /* Array of registers */
){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pFunc;
    int regArg;
    int nArg = windowArgCount(pWin);
    int i;

    for(i=0; i<nArg; i++){
      if( i!=1 || pFunc->zName!=nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+i, reg+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+i, reg+i);
      }
    }
    regArg = reg;

    if( pMWin->regStartRowid==0
     && (pFunc->funcFlags & SQLITE_FUNC_MINMAX) 
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      int addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regArg);
      VdbeCoverage(v);
      if( bInverse==0 ){
        sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1, 1);
        sqlite3VdbeAddOp2(v, OP_SCopy, regArg, pWin->regApp);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, pWin->regApp, 2, pWin->regApp+2);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, pWin->csrApp, pWin->regApp+2);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, pWin->csrApp, 0, regArg, 1);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp1(v, OP_Delete, pWin->csrApp);
        sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      }
      sqlite3VdbeJumpHere(v, addrIsNull);
    }else if( pWin->regApp ){
      assert( pFunc->zName==nth_valueName
           || pFunc->zName==first_valueName
      );
      assert( bInverse==0 || bInverse==1 );
      sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1-bInverse, 1);
    }else if( pFunc->xSFunc!=noopStepFunc ){
      int addrIf = 0;
      if( pWin->pFilter ){
        int regTmp;
        assert( nArg==0 || nArg==pWin->pOwner->x.pList->nExpr );
        assert( nArg || pWin->pOwner->x.pList==0 );
        regTmp = sqlite3GetTempReg(pParse);
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+nArg,regTmp);
        addrIf = sqlite3VdbeAddOp3(v, OP_IfNot, regTmp, 0, 1);
        VdbeCoverage(v);
        sqlite3ReleaseTempReg(pParse, regTmp);
      }
      if( pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl;
        assert( nArg>0 );
        pColl = sqlite3ExprNNCollSeq(pParse, pWin->pOwner->x.pList->a[0].pExpr);
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0,0,0, (const char*)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, bInverse? OP_AggInverse : OP_AggStep, 
                        bInverse, regArg, pWin->regAccum);
      sqlite3VdbeAppendP4(v, pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u8)nArg);
      if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
    }
  }
}